

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O0

int memcache_bin_create_request(application_protocol *proto,request *req)

{
  long *plVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  long *in_FS_OFFSET;
  double dVar6;
  iovec *key;
  int key_idx;
  long val_len;
  kv_info *info;
  request *req_local;
  application_protocol *proto_local;
  
  memset((void *)(*in_FS_OFFSET + -0x70),0,0x18);
  *(undefined8 *)(*in_FS_OFFSET + -0x58) = 0;
  plVar1 = (long *)proto->arg;
  dVar6 = generate((rand_gen *)plVar1[2]);
  puVar4 = (undefined8 *)(*(long *)(*plVar1 + 0x18) + (long)(int)dVar6 * 0x10);
  *(undefined1 *)(*in_FS_OFFSET + -0x70) = 0x80;
  uVar2 = htons((uint16_t)puVar4[1]);
  *(uint16_t *)(*in_FS_OFFSET + -0x6e) = uVar2;
  *(undefined1 *)(*in_FS_OFFSET + -0x6b) = 0;
  *(undefined2 *)(*in_FS_OFFSET + -0x6a) = 0;
  if (puVar4 == (undefined8 *)0x0) {
    __assert_fail("key != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/memcache.c"
                  ,0xdf,
                  "int memcache_bin_create_request(struct application_protocol *, struct request *)"
                 );
  }
  dVar6 = drand48();
  if (dVar6 < (double)plVar1[3] || dVar6 == (double)plVar1[3]) {
    *(undefined1 *)(*in_FS_OFFSET + -0x6f) = 0xc;
    *(undefined1 *)(*in_FS_OFFSET + -0x6c) = 0;
    uVar3 = htonl((uint32_t)puVar4[1]);
    *(uint32_t *)(*in_FS_OFFSET + -0x68) = uVar3;
    req->iovs[0].iov_base = (void *)(*in_FS_OFFSET + -0x70);
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)*puVar4;
    req->iovs[1].iov_len = puVar4[1];
    req->iov_cnt = 2;
  }
  else {
    dVar6 = generate((rand_gen *)plVar1[1]);
    sVar5 = lround(dVar6);
    if (0x200000 < (long)sVar5) {
      __assert_fail("val_len <= MAX_VAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/memcache.c"
                    ,0xe4,
                    "int memcache_bin_create_request(struct application_protocol *, struct request *)"
                   );
    }
    *(undefined1 *)(*in_FS_OFFSET + -0x6f) = 1;
    *(undefined1 *)(*in_FS_OFFSET + -0x6c) = 8;
    uVar3 = htonl((int)puVar4[1] + (int)sVar5 + (uint)*(byte *)(*in_FS_OFFSET + -0x6c));
    *(uint32_t *)(*in_FS_OFFSET + -0x68) = uVar3;
    req->iovs[0].iov_base = (void *)(*in_FS_OFFSET + -0x70);
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)(*in_FS_OFFSET + -0x58);
    req->iovs[1].iov_len = 8;
    req->iovs[2].iov_base = (void *)*puVar4;
    req->iovs[2].iov_len = puVar4[1];
    req->iovs[3].iov_base = random_char;
    req->iovs[3].iov_len = sVar5;
    req->iov_cnt = 4;
  }
  return 0;
}

Assistant:

static int memcache_bin_create_request(struct application_protocol *proto,
									   struct request *req)
{
	struct kv_info *info;
	long val_len;
	int key_idx;
	struct iovec *key;

	bzero(&header, sizeof(struct bmc_header));
	extras = 0;

	info = (struct kv_info *)proto->arg;
	key_idx = generate(info->key_sel);
	key = &info->key->keys[key_idx];

	header.magic = 0x80;
	header.key_len = htons(key->iov_len);
	header.data_type = 0x00;
	header.vbucket = 0x00;
	assert(key != NULL);

	if (drand48() > info->get_ratio) {
		// set
		val_len = lround(generate(info->val_len));
		assert(val_len <= MAX_VAL_SIZE);

		header.opcode = CMD_SET;
		header.extra_len = 0x08; // sets have extras for flags and expiration
		header.body_len = htonl(key->iov_len + val_len + header.extra_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = &extras;
		req->iovs[1].iov_len = sizeof(uint64_t);
		req->iovs[2].iov_base = key->iov_base;
		req->iovs[2].iov_len = key->iov_len;
		req->iovs[3].iov_base = random_char;
		req->iovs[3].iov_len = val_len;

		req->iov_cnt = 4;
	} else {
		// get
		header.opcode = CMD_GETK;
		header.extra_len = 0x00;
		header.body_len = htonl(key->iov_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = key->iov_base;
		req->iovs[1].iov_len = key->iov_len;

		req->iov_cnt = 2;
	}

	return 0;
}